

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void ImGui::EndTable(void)

{
  ImVec2 *pIVar1;
  short sVar2;
  uint uVar3;
  float fVar4;
  ImGuiWindow *pIVar5;
  float lhs;
  ImGuiContext *pIVar6;
  bool bVar7;
  int iVar8;
  ImPoolIdx IVar9;
  ImGuiTableInstanceData *pIVar10;
  ImGuiTableColumn *pIVar11;
  ImGuiTableTempData *pIVar12;
  ImGuiTable *pIVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  ImGuiTable *in_stack_00000020;
  ImGuiTable *in_stack_00000040;
  float decoration_size_1;
  float decoration_size;
  float inner_content_max_x;
  short backup_nav_layers_active_mask;
  ImVec2 backup_outer_max_pos;
  float new_width;
  float new_x2;
  ImGuiTableColumn *column_2;
  ImGuiTableColumn *column_1;
  float neighbor_width_to_keep_visible;
  float width_spacings;
  float column_width_request;
  ImGuiTableColumn *column;
  int column_n;
  float auto_fit_width_for_stretched_min;
  float auto_fit_width_for_stretched;
  float auto_fit_width_for_fixed;
  ImDrawListSplitter *splitter;
  ImGuiTable *in_stack_000000c0;
  float max_pos_x;
  float outer_padding_for_border;
  float inner_content_max_y;
  ImGuiTableInstanceData *table_instance;
  ImGuiTableTempData *temp_data;
  ImGuiWindow *outer_window;
  ImGuiWindow *inner_window;
  ImGuiTableFlags flags;
  ImGuiTable *table;
  ImGuiContext *g;
  undefined4 in_stack_fffffffffffffef8;
  ImPoolIdx in_stack_fffffffffffffefc;
  ImDrawList *in_stack_ffffffffffffff00;
  ImGuiTableColumn *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  ImGuiItemFlags in_stack_ffffffffffffff14;
  undefined4 in_stack_ffffffffffffff18;
  float in_stack_ffffffffffffff1c;
  undefined4 in_stack_ffffffffffffff20;
  uint in_stack_ffffffffffffff24;
  ImGuiID id;
  float in_stack_ffffffffffffff28;
  float in_stack_ffffffffffffff30;
  float in_stack_ffffffffffffff34;
  float local_c4;
  float local_a8;
  float fStack_a4;
  ImDrawList *in_stack_ffffffffffffff68;
  ImDrawListSplitter *in_stack_ffffffffffffff70;
  int local_70;
  float local_6c;
  float local_68;
  float local_64;
  ImVec2 local_54;
  ImVec2 local_4c;
  float local_44;
  ImGuiWindow *window;
  
  pIVar6 = GImGui;
  pIVar13 = GImGui->CurrentTable;
  if ((pIVar13->IsLayoutLocked & 1U) == 0) {
    TableUpdateLayout(in_stack_00000040);
  }
  uVar3 = pIVar13->Flags;
  window = pIVar13->InnerWindow;
  pIVar5 = pIVar13->OuterWindow;
  pIVar12 = pIVar13->TempData;
  if ((pIVar13->IsInsideRow & 1U) != 0) {
    TableEndRow((ImGuiTable *)window);
  }
  if (((((uVar3 & 0x20) != 0) && (pIVar13->HoveredColumnBody != -1)) &&
      (bVar7 = IsAnyItemHovered(), !bVar7)) &&
     (bVar7 = IsMouseReleased((ImGuiMouseButton)((ulong)in_stack_ffffffffffffff00 >> 0x20)), bVar7))
  {
    TableOpenContextMenu(in_stack_ffffffffffffff14);
  }
  pIVar10 = TableGetInstanceData
                      ((ImGuiTable *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),0
                      );
  (window->DC).PrevLineSize = pIVar12->HostBackupPrevLineSize;
  (window->DC).CurrLineSize = pIVar12->HostBackupCurrLineSize;
  (window->DC).CursorMaxPos = pIVar12->HostBackupCursorMaxPos;
  fVar17 = pIVar13->RowPosY2;
  if (window == pIVar5) {
    if ((uVar3 & 0x20000) == 0) {
      fVar4 = ImMax<float>((pIVar13->OuterRect).Max.y,fVar17);
      (pIVar13->InnerRect).Max.y = fVar4;
      (pIVar13->OuterRect).Max.y = fVar4;
    }
  }
  else {
    (window->DC).CursorMaxPos.y = fVar17;
  }
  fVar4 = ImMax<float>((pIVar13->WorkRect).Max.y,(pIVar13->OuterRect).Max.y);
  (pIVar13->WorkRect).Max.y = fVar4;
  fVar4 = ImRect::GetHeight(&pIVar13->OuterRect);
  pIVar10->LastOuterHeight = fVar4;
  if ((pIVar13->Flags & 0x1000000U) != 0) {
    local_c4 = 1.0;
    if ((pIVar13->Flags & 0x400U) == 0) {
      local_c4 = 0.0;
    }
    fVar4 = (pIVar13->InnerWindow->DC).CursorMaxPos.x;
    local_44 = fVar4;
    if (pIVar13->RightMostEnabledColumn != -1) {
      pIVar11 = ImSpan<ImGuiTableColumn>::operator[]
                          (&pIVar13->Columns,(int)pIVar13->RightMostEnabledColumn);
      local_44 = ImMax<float>(fVar4,(pIVar11->WorkMaxX + pIVar13->CellPaddingX +
                                    pIVar13->OuterPaddingX) - local_c4);
      in_stack_ffffffffffffff34 = fVar4;
    }
    if (pIVar13->ResizedColumn != -1) {
      local_44 = ImMax<float>(local_44,pIVar13->ResizeLockMinContentsX2);
    }
    (pIVar13->InnerWindow->DC).CursorMaxPos.x =
         local_44 + pIVar13->TempData->AngledHeadersExtraWidth;
  }
  if ((uVar3 & 0x100000) == 0) {
    ImDrawList::PopClipRect(in_stack_ffffffffffffff00);
  }
  ImVector<ImVec4>::back(&window->DrawList->_ClipRectStack);
  ImRect::ImRect((ImRect *)in_stack_ffffffffffffff00,
                 (ImVec4 *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  (window->ClipRect).Min = local_54;
  (window->ClipRect).Max = local_4c;
  if ((uVar3 & 0x780) != 0) {
    TableDrawBorders(in_stack_00000020);
  }
  ImDrawListSplitter::SetCurrentChannel
            ((ImDrawListSplitter *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
             (ImDrawList *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
             in_stack_ffffffffffffff14);
  if ((pIVar13->Flags & 0x100000U) == 0) {
    TableMergeDrawChannels(in_stack_000000c0);
  }
  ImDrawListSplitter::Merge(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  local_64 = 0.0;
  local_68 = 0.0;
  local_6c = 0.0;
  for (local_70 = 0; local_70 < pIVar13->ColumnsCount; local_70 = local_70 + 1) {
    if ((pIVar13->EnabledMaskByIndex[local_70 >> 5] & 1 << ((byte)local_70 & 0x1f)) != 0) {
      pIVar11 = ImSpan<ImGuiTableColumn>::operator[](&pIVar13->Columns,local_70);
      if (((pIVar11->Flags & 0x10U) == 0) || ((pIVar11->Flags & 0x20U) != 0)) {
        in_stack_ffffffffffffff30 =
             TableGetColumnWidthAuto
                       ((ImGuiTable *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                        in_stack_ffffffffffffff08);
      }
      else {
        in_stack_ffffffffffffff30 = pIVar11->WidthRequest;
      }
      if ((pIVar11->Flags & 0x10U) == 0) {
        local_68 = in_stack_ffffffffffffff30 + local_68;
      }
      else {
        local_64 = in_stack_ffffffffffffff30 + local_64;
      }
      if (((pIVar11->Flags & 8U) != 0) && ((pIVar11->Flags & 0x20U) != 0)) {
        local_6c = ImMax<float>(local_6c,in_stack_ffffffffffffff30 /
                                         (pIVar11->StretchWeight / pIVar13->ColumnsStretchSumWeights
                                         ));
      }
    }
  }
  local_64 = pIVar13->CellPaddingX * 2.0 * (float)(int)pIVar13->ColumnsEnabledCount +
             pIVar13->OuterPaddingX + pIVar13->OuterPaddingX +
             (pIVar13->CellSpacingX1 + pIVar13->CellSpacingX2) *
             (float)(pIVar13->ColumnsEnabledCount + -1) + local_64;
  fVar4 = ImMax<float>(local_68,local_6c);
  pIVar13->ColumnsAutoFitWidth = local_64 + fVar4;
  if (((pIVar13->Flags & 0x1000000U) == 0) && (window != pIVar5)) {
    (window->Scroll).x = 0.0;
  }
  else if ((pIVar13->LastResizedColumn != -1) &&
          (((pIVar13->ResizedColumn == -1 && (((uint)*(float *)&window->ScrollbarX & 1) != 0)) &&
           (pIVar13->InstanceInteracted == pIVar13->InstanceCurrent)))) {
    fVar4 = pIVar13->CellPaddingX + pIVar13->CellPaddingX + pIVar13->MinColumnWidth;
    pIVar11 = ImSpan<ImGuiTableColumn>::operator[]
                        (&pIVar13->Columns,(int)pIVar13->LastResizedColumn);
    if ((pIVar13->InnerClipRect).Min.x <= pIVar11->MaxX) {
      pIVar1 = &(pIVar13->InnerClipRect).Max;
      if (pIVar1->x <= pIVar11->MaxX && pIVar11->MaxX != pIVar1->x) {
        SetScrollFromPosX(window,(pIVar11->MaxX - (window->Pos).x) + fVar4,1.0);
      }
    }
    else {
      SetScrollFromPosX(window,(pIVar11->MaxX - (window->Pos).x) - fVar4,1.0);
    }
  }
  if ((pIVar13->ResizedColumn != -1) && (pIVar13->InstanceCurrent == pIVar13->InstanceInteracted)) {
    pIVar11 = ImSpan<ImGuiTableColumn>::operator[](&pIVar13->Columns,(int)pIVar13->ResizedColumn);
    in_stack_ffffffffffffff28 = (pIVar6->IO).MousePos.x - (pIVar6->ActiveIdClickOffset).x;
    fVar4 = ImTrunc(pIVar6->CurrentDpiScale * 4.0);
    fVar4 = ImTrunc(-pIVar13->CellPaddingX + -pIVar13->CellPaddingX +
                    (((in_stack_ffffffffffffff28 + fVar4) - pIVar11->MinX) - pIVar13->CellSpacingX1)
                   );
    pIVar13->ResizedColumnNextWidth = fVar4;
  }
  id = in_stack_ffffffffffffff24 & 0xffffff;
  if (pIVar6->ActiveIdIsAlive != 0) {
    id = CONCAT13((pIVar13->IsActiveIdAliveBeforeTable & 1U) == 0,(int3)in_stack_ffffffffffffff24);
  }
  pIVar13->IsActiveIdInTable = SUB41(id >> 0x18,0);
  if (0 < pIVar13->InstanceCurrent) {
    PopID();
  }
  PopID();
  fVar4 = (pIVar5->DC).CursorMaxPos.x;
  lhs = (pIVar5->DC).CursorMaxPos.y;
  (window->WorkRect).Min = (pIVar12->HostBackupWorkRect).Min;
  (window->WorkRect).Max = (pIVar12->HostBackupWorkRect).Max;
  (window->ParentWorkRect).Min = (pIVar12->HostBackupParentWorkRect).Min;
  (window->ParentWorkRect).Max = (pIVar12->HostBackupParentWorkRect).Max;
  window->SkipItems = (bool)(pIVar13->HostSkipItems & 1);
  (pIVar5->DC).CursorPos = (pIVar13->OuterRect).Min;
  (pIVar5->DC).ItemWidth = pIVar12->HostBackupItemWidth;
  (pIVar5->DC).ItemWidthStack.Size = pIVar12->HostBackupItemWidthStackSize;
  (pIVar5->DC).ColumnsOffset.x = (pIVar12->HostBackupColumnsOffset).x;
  if (window == pIVar5) {
    ImRect::GetSize((ImRect *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    ItemSize((ImVec2 *)CONCAT44(id,in_stack_ffffffffffffff20),in_stack_ffffffffffffff1c);
    ItemAdd((ImRect *)CONCAT44(local_64,in_stack_ffffffffffffff28),id,
            (ImRect *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
            in_stack_ffffffffffffff14);
  }
  else {
    sVar2 = (window->DC).NavLayersActiveMask;
    (window->DC).NavLayersActiveMask = (window->DC).NavLayersActiveMask | 1;
    EndChild();
    (window->DC).NavLayersActiveMask = sVar2;
  }
  if ((pIVar13->Flags & 0x10000U) == 0) {
    if (0.0 < (pIVar12->UserOuterSize).x) {
      fVar4 = ImMax<float>(fVar4,(pIVar13->OuterRect).Max.x);
      (pIVar5->DC).CursorMaxPos.x = fVar4;
    }
    else {
      fVar16 = (pIVar13->OuterRect).Min.x + pIVar13->ColumnsAutoFitWidth;
      if ((pIVar13->Flags & 0x2000000U) == 0) {
        fVar14 = 0.0;
      }
      else {
        fVar14 = (window->ScrollbarSizes).x;
      }
      fVar14 = pIVar13->TempData->AngledHeadersExtraWidth + fVar14;
      fVar15 = ImMax<float>((pIVar5->DC).IdealMaxPos.x,
                            (fVar16 + fVar14) - (pIVar12->UserOuterSize).x);
      (pIVar5->DC).IdealMaxPos.x = fVar15;
      fVar16 = ImMin<float>((pIVar13->OuterRect).Max.x,fVar16 + fVar14);
      fVar4 = ImMax<float>(fVar4,fVar16);
      (pIVar5->DC).CursorMaxPos.x = fVar4;
    }
  }
  else {
    fVar4 = ImMax<float>(fVar4,(pIVar13->OuterRect).Min.x + pIVar13->ColumnsAutoFitWidth);
    (pIVar5->DC).CursorMaxPos.x = fVar4;
  }
  if (0.0 < (pIVar12->UserOuterSize).y) {
    fVar17 = ImMax<float>(lhs,(pIVar13->OuterRect).Max.y);
    (pIVar5->DC).CursorMaxPos.y = fVar17;
  }
  else {
    if ((pIVar13->Flags & 0x1000000U) == 0) {
      fVar4 = 0.0;
    }
    else {
      fVar4 = (window->ScrollbarSizes).y;
    }
    fVar16 = ImMax<float>((pIVar5->DC).IdealMaxPos.y,(fVar17 + fVar4) - (pIVar12->UserOuterSize).y);
    (pIVar5->DC).IdealMaxPos.y = fVar16;
    fVar17 = ImMin<float>((pIVar13->OuterRect).Max.y,fVar17 + fVar4);
    fVar17 = ImMax<float>(lhs,fVar17);
    (pIVar5->DC).CursorMaxPos.y = fVar17;
  }
  if ((pIVar13->IsSettingsDirty & 1U) != 0) {
    TableSaveSettings((ImGuiTable *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
  }
  pIVar13->IsInitializing = false;
  iVar8 = pIVar6->TablesTempDataStacked + -1;
  pIVar6->TablesTempDataStacked = iVar8;
  if (iVar8 < 1) {
    pIVar12 = (ImGuiTableTempData *)0x0;
  }
  else {
    pIVar12 = ImVector<ImGuiTableTempData>::operator[]
                        (&pIVar6->TablesTempData,pIVar6->TablesTempDataStacked + -1);
  }
  if (pIVar12 == (ImGuiTableTempData *)0x0) {
    pIVar13 = (ImGuiTable *)0x0;
  }
  else {
    pIVar13 = ImPool<ImGuiTable>::GetByIndex
                        ((ImPool<ImGuiTable> *)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
  }
  pIVar6->CurrentTable = pIVar13;
  if (pIVar6->CurrentTable != (ImGuiTable *)0x0) {
    pIVar6->CurrentTable->TempData = pIVar12;
    pIVar6->CurrentTable->DrawSplitter = &pIVar12->DrawSplitter;
  }
  if (pIVar6->CurrentTable == (ImGuiTable *)0x0) {
    IVar9 = -1;
  }
  else {
    IVar9 = ImPool<ImGuiTable>::GetIndex(&pIVar6->Tables,pIVar6->CurrentTable);
  }
  (pIVar5->DC).CurrentTableIdx = IVar9;
  NavUpdateCurrentWindowIsScrollPushableX();
  return;
}

Assistant:

void    ImGui::EndTable()
{
    ImGuiContext& g = *GImGui;
    ImGuiTable* table = g.CurrentTable;
    IM_ASSERT(table != NULL && "Only call EndTable() if BeginTable() returns true!");

    // This assert would be very useful to catch a common error... unfortunately it would probably trigger in some
    // cases, and for consistency user may sometimes output empty tables (and still benefit from e.g. outer border)
    //IM_ASSERT(table->IsLayoutLocked && "Table unused: never called TableNextRow(), is that the intent?");

    // If the user never got to call TableNextRow() or TableNextColumn(), we call layout ourselves to ensure all our
    // code paths are consistent (instead of just hoping that TableBegin/TableEnd will work), get borders drawn, etc.
    if (!table->IsLayoutLocked)
        TableUpdateLayout(table);

    const ImGuiTableFlags flags = table->Flags;
    ImGuiWindow* inner_window = table->InnerWindow;
    ImGuiWindow* outer_window = table->OuterWindow;
    ImGuiTableTempData* temp_data = table->TempData;
    IM_ASSERT(inner_window == g.CurrentWindow);
    IM_ASSERT(outer_window == inner_window || outer_window == inner_window->ParentWindow);

    if (table->IsInsideRow)
        TableEndRow(table);

    // Context menu in columns body
    if (flags & ImGuiTableFlags_ContextMenuInBody)
        if (table->HoveredColumnBody != -1 && !IsAnyItemHovered() && IsMouseReleased(ImGuiMouseButton_Right))
            TableOpenContextMenu((int)table->HoveredColumnBody);

    // Finalize table height
    ImGuiTableInstanceData* table_instance = TableGetInstanceData(table, table->InstanceCurrent);
    inner_window->DC.PrevLineSize = temp_data->HostBackupPrevLineSize;
    inner_window->DC.CurrLineSize = temp_data->HostBackupCurrLineSize;
    inner_window->DC.CursorMaxPos = temp_data->HostBackupCursorMaxPos;
    const float inner_content_max_y = table->RowPosY2;
    IM_ASSERT(table->RowPosY2 == inner_window->DC.CursorPos.y);
    if (inner_window != outer_window)
        inner_window->DC.CursorMaxPos.y = inner_content_max_y;
    else if (!(flags & ImGuiTableFlags_NoHostExtendY))
        table->OuterRect.Max.y = table->InnerRect.Max.y = ImMax(table->OuterRect.Max.y, inner_content_max_y); // Patch OuterRect/InnerRect height
    table->WorkRect.Max.y = ImMax(table->WorkRect.Max.y, table->OuterRect.Max.y);
    table_instance->LastOuterHeight = table->OuterRect.GetHeight();

    // Setup inner scrolling range
    // FIXME: This ideally should be done earlier, in BeginTable() SetNextWindowContentSize call, just like writing to inner_window->DC.CursorMaxPos.y,
    // but since the later is likely to be impossible to do we'd rather update both axises together.
    if (table->Flags & ImGuiTableFlags_ScrollX)
    {
        const float outer_padding_for_border = (table->Flags & ImGuiTableFlags_BordersOuterV) ? TABLE_BORDER_SIZE : 0.0f;
        float max_pos_x = table->InnerWindow->DC.CursorMaxPos.x;
        if (table->RightMostEnabledColumn != -1)
            max_pos_x = ImMax(max_pos_x, table->Columns[table->RightMostEnabledColumn].WorkMaxX + table->CellPaddingX + table->OuterPaddingX - outer_padding_for_border);
        if (table->ResizedColumn != -1)
            max_pos_x = ImMax(max_pos_x, table->ResizeLockMinContentsX2);
        table->InnerWindow->DC.CursorMaxPos.x = max_pos_x + table->TempData->AngledHeadersExtraWidth;
    }

    // Pop clipping rect
    if (!(flags & ImGuiTableFlags_NoClip))
        inner_window->DrawList->PopClipRect();
    inner_window->ClipRect = inner_window->DrawList->_ClipRectStack.back();

    // Draw borders
    if ((flags & ImGuiTableFlags_Borders) != 0)
        TableDrawBorders(table);

#if 0
    // Strip out dummy channel draw calls
    // We have no way to prevent user submitting direct ImDrawList calls into a hidden column (but ImGui:: calls will be clipped out)
    // Pros: remove draw calls which will have no effect. since they'll have zero-size cliprect they may be early out anyway.
    // Cons: making it harder for users watching metrics/debugger to spot the wasted vertices.
    if (table->DummyDrawChannel != (ImGuiTableColumnIdx)-1)
    {
        ImDrawChannel* dummy_channel = &table->DrawSplitter._Channels[table->DummyDrawChannel];
        dummy_channel->_CmdBuffer.resize(0);
        dummy_channel->_IdxBuffer.resize(0);
    }
#endif

    // Flatten channels and merge draw calls
    ImDrawListSplitter* splitter = table->DrawSplitter;
    splitter->SetCurrentChannel(inner_window->DrawList, 0);
    if ((table->Flags & ImGuiTableFlags_NoClip) == 0)
        TableMergeDrawChannels(table);
    splitter->Merge(inner_window->DrawList);

    // Update ColumnsAutoFitWidth to get us ahead for host using our size to auto-resize without waiting for next BeginTable()
    float auto_fit_width_for_fixed = 0.0f;
    float auto_fit_width_for_stretched = 0.0f;
    float auto_fit_width_for_stretched_min = 0.0f;
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
        if (IM_BITARRAY_TESTBIT(table->EnabledMaskByIndex, column_n))
        {
            ImGuiTableColumn* column = &table->Columns[column_n];
            float column_width_request = ((column->Flags & ImGuiTableColumnFlags_WidthFixed) && !(column->Flags & ImGuiTableColumnFlags_NoResize)) ? column->WidthRequest : TableGetColumnWidthAuto(table, column);
            if (column->Flags & ImGuiTableColumnFlags_WidthFixed)
                auto_fit_width_for_fixed += column_width_request;
            else
                auto_fit_width_for_stretched += column_width_request;
            if ((column->Flags & ImGuiTableColumnFlags_WidthStretch) && (column->Flags & ImGuiTableColumnFlags_NoResize) != 0)
                auto_fit_width_for_stretched_min = ImMax(auto_fit_width_for_stretched_min, column_width_request / (column->StretchWeight / table->ColumnsStretchSumWeights));
        }
    const float width_spacings = (table->OuterPaddingX * 2.0f) + (table->CellSpacingX1 + table->CellSpacingX2) * (table->ColumnsEnabledCount - 1);
    table->ColumnsAutoFitWidth = width_spacings + (table->CellPaddingX * 2.0f) * table->ColumnsEnabledCount + auto_fit_width_for_fixed + ImMax(auto_fit_width_for_stretched, auto_fit_width_for_stretched_min);

    // Update scroll
    if ((table->Flags & ImGuiTableFlags_ScrollX) == 0 && inner_window != outer_window)
    {
        inner_window->Scroll.x = 0.0f;
    }
    else if (table->LastResizedColumn != -1 && table->ResizedColumn == -1 && inner_window->ScrollbarX && table->InstanceInteracted == table->InstanceCurrent)
    {
        // When releasing a column being resized, scroll to keep the resulting column in sight
        const float neighbor_width_to_keep_visible = table->MinColumnWidth + table->CellPaddingX * 2.0f;
        ImGuiTableColumn* column = &table->Columns[table->LastResizedColumn];
        if (column->MaxX < table->InnerClipRect.Min.x)
            SetScrollFromPosX(inner_window, column->MaxX - inner_window->Pos.x - neighbor_width_to_keep_visible, 1.0f);
        else if (column->MaxX > table->InnerClipRect.Max.x)
            SetScrollFromPosX(inner_window, column->MaxX - inner_window->Pos.x + neighbor_width_to_keep_visible, 1.0f);
    }

    // Apply resizing/dragging at the end of the frame
    if (table->ResizedColumn != -1 && table->InstanceCurrent == table->InstanceInteracted)
    {
        ImGuiTableColumn* column = &table->Columns[table->ResizedColumn];
        const float new_x2 = (g.IO.MousePos.x - g.ActiveIdClickOffset.x + ImTrunc(TABLE_RESIZE_SEPARATOR_HALF_THICKNESS * g.CurrentDpiScale));
        const float new_width = ImTrunc(new_x2 - column->MinX - table->CellSpacingX1 - table->CellPaddingX * 2.0f);
        table->ResizedColumnNextWidth = new_width;
    }

    table->IsActiveIdInTable = (g.ActiveIdIsAlive != 0 && table->IsActiveIdAliveBeforeTable == false);

    // Pop from id stack
    IM_ASSERT_USER_ERROR(inner_window->IDStack.back() == table_instance->TableInstanceID, "Mismatching PushID/PopID!");
    IM_ASSERT_USER_ERROR(outer_window->DC.ItemWidthStack.Size >= temp_data->HostBackupItemWidthStackSize, "Too many PopItemWidth!");
    if (table->InstanceCurrent > 0)
        PopID();
    PopID();

    // Restore window data that we modified
    const ImVec2 backup_outer_max_pos = outer_window->DC.CursorMaxPos;
    inner_window->WorkRect = temp_data->HostBackupWorkRect;
    inner_window->ParentWorkRect = temp_data->HostBackupParentWorkRect;
    inner_window->SkipItems = table->HostSkipItems;
    outer_window->DC.CursorPos = table->OuterRect.Min;
    outer_window->DC.ItemWidth = temp_data->HostBackupItemWidth;
    outer_window->DC.ItemWidthStack.Size = temp_data->HostBackupItemWidthStackSize;
    outer_window->DC.ColumnsOffset = temp_data->HostBackupColumnsOffset;

    // Layout in outer window
    // (FIXME: To allow auto-fit and allow desirable effect of SameLine() we dissociate 'used' vs 'ideal' size by overriding
    // CursorPosPrevLine and CursorMaxPos manually. That should be a more general layout feature, see same problem e.g. #3414)
    if (inner_window != outer_window)
    {
        short backup_nav_layers_active_mask = inner_window->DC.NavLayersActiveMask;
        inner_window->DC.NavLayersActiveMask |= 1 << ImGuiNavLayer_Main; // So empty table don't appear to navigate differently.
        EndChild();
        inner_window->DC.NavLayersActiveMask = backup_nav_layers_active_mask;
    }
    else
    {
        ItemSize(table->OuterRect.GetSize());
        ItemAdd(table->OuterRect, 0);
    }

    // Override declared contents width/height to enable auto-resize while not needlessly adding a scrollbar
    if (table->Flags & ImGuiTableFlags_NoHostExtendX)
    {
        // FIXME-TABLE: Could we remove this section?
        // ColumnsAutoFitWidth may be one frame ahead here since for Fixed+NoResize is calculated from latest contents
        IM_ASSERT((table->Flags & ImGuiTableFlags_ScrollX) == 0);
        outer_window->DC.CursorMaxPos.x = ImMax(backup_outer_max_pos.x, table->OuterRect.Min.x + table->ColumnsAutoFitWidth);
    }
    else if (temp_data->UserOuterSize.x <= 0.0f)
    {
        // Some references for this: #7651 + tests "table_reported_size", "table_reported_size_outer" equivalent Y block
        // - Checking for ImGuiTableFlags_ScrollX/ScrollY flag makes us a frame ahead when disabling those flags.
        // - FIXME-TABLE: Would make sense to pre-compute expected scrollbar visibility/sizes to generally save a frame of feedback.
        const float inner_content_max_x = table->OuterRect.Min.x + table->ColumnsAutoFitWidth; // Slightly misleading name but used for code symmetry with inner_content_max_y
        const float decoration_size = table->TempData->AngledHeadersExtraWidth + ((table->Flags & ImGuiTableFlags_ScrollY) ? inner_window->ScrollbarSizes.x : 0.0f);
        outer_window->DC.IdealMaxPos.x = ImMax(outer_window->DC.IdealMaxPos.x, inner_content_max_x + decoration_size - temp_data->UserOuterSize.x);
        outer_window->DC.CursorMaxPos.x = ImMax(backup_outer_max_pos.x, ImMin(table->OuterRect.Max.x, inner_content_max_x + decoration_size));
    }
    else
    {
        outer_window->DC.CursorMaxPos.x = ImMax(backup_outer_max_pos.x, table->OuterRect.Max.x);
    }
    if (temp_data->UserOuterSize.y <= 0.0f)
    {
        const float decoration_size = (table->Flags & ImGuiTableFlags_ScrollX) ? inner_window->ScrollbarSizes.y : 0.0f;
        outer_window->DC.IdealMaxPos.y = ImMax(outer_window->DC.IdealMaxPos.y, inner_content_max_y + decoration_size - temp_data->UserOuterSize.y);
        outer_window->DC.CursorMaxPos.y = ImMax(backup_outer_max_pos.y, ImMin(table->OuterRect.Max.y, inner_content_max_y + decoration_size));
    }
    else
    {
        // OuterRect.Max.y may already have been pushed downward from the initial value (unless ImGuiTableFlags_NoHostExtendY is set)
        outer_window->DC.CursorMaxPos.y = ImMax(backup_outer_max_pos.y, table->OuterRect.Max.y);
    }

    // Save settings
    if (table->IsSettingsDirty)
        TableSaveSettings(table);
    table->IsInitializing = false;

    // Clear or restore current table, if any
    IM_ASSERT(g.CurrentWindow == outer_window && g.CurrentTable == table);
    IM_ASSERT(g.TablesTempDataStacked > 0);
    temp_data = (--g.TablesTempDataStacked > 0) ? &g.TablesTempData[g.TablesTempDataStacked - 1] : NULL;
    g.CurrentTable = temp_data ? g.Tables.GetByIndex(temp_data->TableIndex) : NULL;
    if (g.CurrentTable)
    {
        g.CurrentTable->TempData = temp_data;
        g.CurrentTable->DrawSplitter = &temp_data->DrawSplitter;
    }
    outer_window->DC.CurrentTableIdx = g.CurrentTable ? g.Tables.GetIndex(g.CurrentTable) : -1;
    NavUpdateCurrentWindowIsScrollPushableX();
}